

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matchit.h
# Opt level: O2

void __thiscall
matchit::impl::Id<mathiu::impl::RelationalKind>::Id
          (Id<mathiu::impl::RelationalKind> *this,Id<mathiu::impl::RelationalKind> *id)

{
  IdBlock<mathiu::impl::RelationalKind> *pIVar1;
  uint local_1c [5];
  
  local_1c[1] = 0;
  local_1c[2] = 0;
  local_1c[3] = 0;
  local_1c[4] = 0;
  *(undefined4 *)
   &(this->mBlock).
    super__Variant_base<matchit::impl::IdBlock<mathiu::impl::RelationalKind>,_matchit::impl::IdBlock<mathiu::impl::RelationalKind>_*>
    .
    super__Move_assign_alias<matchit::impl::IdBlock<mathiu::impl::RelationalKind>,_matchit::impl::IdBlock<mathiu::impl::RelationalKind>_*>
    .
    super__Copy_assign_alias<matchit::impl::IdBlock<mathiu::impl::RelationalKind>,_matchit::impl::IdBlock<mathiu::impl::RelationalKind>_*>
    .
    super__Move_ctor_alias<matchit::impl::IdBlock<mathiu::impl::RelationalKind>,_matchit::impl::IdBlock<mathiu::impl::RelationalKind>_*>
    .
    super__Copy_ctor_alias<matchit::impl::IdBlock<mathiu::impl::RelationalKind>,_matchit::impl::IdBlock<mathiu::impl::RelationalKind>_*>
    .
    super__Variant_storage_alias<matchit::impl::IdBlock<mathiu::impl::RelationalKind>,_matchit::impl::IdBlock<mathiu::impl::RelationalKind>_*>
       = 0;
  *(ulong *)((long)&(this->mBlock).
                    super__Variant_base<matchit::impl::IdBlock<mathiu::impl::RelationalKind>,_matchit::impl::IdBlock<mathiu::impl::RelationalKind>_*>
                    .
                    super__Move_assign_alias<matchit::impl::IdBlock<mathiu::impl::RelationalKind>,_matchit::impl::IdBlock<mathiu::impl::RelationalKind>_*>
                    .
                    super__Copy_assign_alias<matchit::impl::IdBlock<mathiu::impl::RelationalKind>,_matchit::impl::IdBlock<mathiu::impl::RelationalKind>_*>
                    .
                    super__Move_ctor_alias<matchit::impl::IdBlock<mathiu::impl::RelationalKind>,_matchit::impl::IdBlock<mathiu::impl::RelationalKind>_*>
                    .
                    super__Copy_ctor_alias<matchit::impl::IdBlock<mathiu::impl::RelationalKind>,_matchit::impl::IdBlock<mathiu::impl::RelationalKind>_*>
                    .
                    super__Variant_storage_alias<matchit::impl::IdBlock<mathiu::impl::RelationalKind>,_matchit::impl::IdBlock<mathiu::impl::RelationalKind>_*>
                    ._M_u + 4) = (ulong)local_1c[0];
  *(undefined8 *)
   ((long)&(this->mBlock).
           super__Variant_base<matchit::impl::IdBlock<mathiu::impl::RelationalKind>,_matchit::impl::IdBlock<mathiu::impl::RelationalKind>_*>
           .
           super__Move_assign_alias<matchit::impl::IdBlock<mathiu::impl::RelationalKind>,_matchit::impl::IdBlock<mathiu::impl::RelationalKind>_*>
           .
           super__Copy_assign_alias<matchit::impl::IdBlock<mathiu::impl::RelationalKind>,_matchit::impl::IdBlock<mathiu::impl::RelationalKind>_*>
           .
           super__Move_ctor_alias<matchit::impl::IdBlock<mathiu::impl::RelationalKind>,_matchit::impl::IdBlock<mathiu::impl::RelationalKind>_*>
           .
           super__Copy_ctor_alias<matchit::impl::IdBlock<mathiu::impl::RelationalKind>,_matchit::impl::IdBlock<mathiu::impl::RelationalKind>_*>
           .
           super__Variant_storage_alias<matchit::impl::IdBlock<mathiu::impl::RelationalKind>,_matchit::impl::IdBlock<mathiu::impl::RelationalKind>_*>
           ._M_u + 0xc) = 0;
  *(undefined4 *)
   &(this->mBlock).
    super__Variant_base<matchit::impl::IdBlock<mathiu::impl::RelationalKind>,_matchit::impl::IdBlock<mathiu::impl::RelationalKind>_*>
    .
    super__Move_assign_alias<matchit::impl::IdBlock<mathiu::impl::RelationalKind>,_matchit::impl::IdBlock<mathiu::impl::RelationalKind>_*>
    .
    super__Copy_assign_alias<matchit::impl::IdBlock<mathiu::impl::RelationalKind>,_matchit::impl::IdBlock<mathiu::impl::RelationalKind>_*>
    .
    super__Move_ctor_alias<matchit::impl::IdBlock<mathiu::impl::RelationalKind>,_matchit::impl::IdBlock<mathiu::impl::RelationalKind>_*>
    .
    super__Copy_ctor_alias<matchit::impl::IdBlock<mathiu::impl::RelationalKind>,_matchit::impl::IdBlock<mathiu::impl::RelationalKind>_*>
    .
    super__Variant_storage_alias<matchit::impl::IdBlock<mathiu::impl::RelationalKind>,_matchit::impl::IdBlock<mathiu::impl::RelationalKind>_*>
    ._M_u._M_first._M_storage.super_IdBlockBase<mathiu::impl::RelationalKind>.mVariant.
    super__Variant_base<std::monostate,_mathiu::impl::RelationalKind,_mathiu::impl::RelationalKind_*,_const_mathiu::impl::RelationalKind_*>
    .
    super__Move_assign_alias<std::monostate,_mathiu::impl::RelationalKind,_mathiu::impl::RelationalKind_*,_const_mathiu::impl::RelationalKind_*>
    .
    super__Copy_assign_alias<std::monostate,_mathiu::impl::RelationalKind,_mathiu::impl::RelationalKind_*,_const_mathiu::impl::RelationalKind_*>
    .
    super__Move_ctor_alias<std::monostate,_mathiu::impl::RelationalKind,_mathiu::impl::RelationalKind_*,_const_mathiu::impl::RelationalKind_*>
    .
    super__Copy_ctor_alias<std::monostate,_mathiu::impl::RelationalKind,_mathiu::impl::RelationalKind_*,_const_mathiu::impl::RelationalKind_*>
    .
    super__Variant_storage_alias<std::monostate,_mathiu::impl::RelationalKind,_mathiu::impl::RelationalKind_*,_const_mathiu::impl::RelationalKind_*>
    .field_0xc = 0;
  (this->mBlock).
  super__Variant_base<matchit::impl::IdBlock<mathiu::impl::RelationalKind>,_matchit::impl::IdBlock<mathiu::impl::RelationalKind>_*>
  .
  super__Move_assign_alias<matchit::impl::IdBlock<mathiu::impl::RelationalKind>,_matchit::impl::IdBlock<mathiu::impl::RelationalKind>_*>
  .
  super__Copy_assign_alias<matchit::impl::IdBlock<mathiu::impl::RelationalKind>,_matchit::impl::IdBlock<mathiu::impl::RelationalKind>_*>
  .
  super__Move_ctor_alias<matchit::impl::IdBlock<mathiu::impl::RelationalKind>,_matchit::impl::IdBlock<mathiu::impl::RelationalKind>_*>
  .
  super__Copy_ctor_alias<matchit::impl::IdBlock<mathiu::impl::RelationalKind>,_matchit::impl::IdBlock<mathiu::impl::RelationalKind>_*>
  .
  super__Variant_storage_alias<matchit::impl::IdBlock<mathiu::impl::RelationalKind>,_matchit::impl::IdBlock<mathiu::impl::RelationalKind>_*>
  ._M_index = '\0';
  pIVar1 = (*std::__detail::__variant::
             __gen_vtable<std::__detail::__variant::__deduce_visit_result<matchit::impl::IdBlock<mathiu::impl::RelationalKind>_&>,_matchit::impl::Overload<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/BowenFu[P]mathiu/build_O2/_deps/matchit-src/include/matchit.h:1320:44),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/BowenFu[P]mathiu/build_O2/_deps/matchit-src/include/matchit.h:1321:44)>_&&,_std::variant<matchit::impl::IdBlock<mathiu::impl::RelationalKind>,_matchit::impl::IdBlock<mathiu::impl::RelationalKind>_*>_&>
             ::_S_vtable._M_arr
             [(id->mBlock).
              super__Variant_base<matchit::impl::IdBlock<mathiu::impl::RelationalKind>,_matchit::impl::IdBlock<mathiu::impl::RelationalKind>_*>
              .
              super__Move_assign_alias<matchit::impl::IdBlock<mathiu::impl::RelationalKind>,_matchit::impl::IdBlock<mathiu::impl::RelationalKind>_*>
              .
              super__Copy_assign_alias<matchit::impl::IdBlock<mathiu::impl::RelationalKind>,_matchit::impl::IdBlock<mathiu::impl::RelationalKind>_*>
              .
              super__Move_ctor_alias<matchit::impl::IdBlock<mathiu::impl::RelationalKind>,_matchit::impl::IdBlock<mathiu::impl::RelationalKind>_*>
              .
              super__Copy_ctor_alias<matchit::impl::IdBlock<mathiu::impl::RelationalKind>,_matchit::impl::IdBlock<mathiu::impl::RelationalKind>_*>
              .
              super__Variant_storage_alias<matchit::impl::IdBlock<mathiu::impl::RelationalKind>,_matchit::impl::IdBlock<mathiu::impl::RelationalKind>_*>
              ._M_index]._M_data)
                     ((Overload<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:1320:44),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:1321:44)>
                       *)local_1c,&id->mBlock);
  *(IdBlock<mathiu::impl::RelationalKind> **)
   &(this->mBlock).
    super__Variant_base<matchit::impl::IdBlock<mathiu::impl::RelationalKind>,_matchit::impl::IdBlock<mathiu::impl::RelationalKind>_*>
    .
    super__Move_assign_alias<matchit::impl::IdBlock<mathiu::impl::RelationalKind>,_matchit::impl::IdBlock<mathiu::impl::RelationalKind>_*>
    .
    super__Copy_assign_alias<matchit::impl::IdBlock<mathiu::impl::RelationalKind>,_matchit::impl::IdBlock<mathiu::impl::RelationalKind>_*>
    .
    super__Move_ctor_alias<matchit::impl::IdBlock<mathiu::impl::RelationalKind>,_matchit::impl::IdBlock<mathiu::impl::RelationalKind>_*>
    .
    super__Copy_ctor_alias<matchit::impl::IdBlock<mathiu::impl::RelationalKind>,_matchit::impl::IdBlock<mathiu::impl::RelationalKind>_*>
    .
    super__Variant_storage_alias<matchit::impl::IdBlock<mathiu::impl::RelationalKind>,_matchit::impl::IdBlock<mathiu::impl::RelationalKind>_*>
       = pIVar1;
  (this->mBlock).
  super__Variant_base<matchit::impl::IdBlock<mathiu::impl::RelationalKind>,_matchit::impl::IdBlock<mathiu::impl::RelationalKind>_*>
  .
  super__Move_assign_alias<matchit::impl::IdBlock<mathiu::impl::RelationalKind>,_matchit::impl::IdBlock<mathiu::impl::RelationalKind>_*>
  .
  super__Copy_assign_alias<matchit::impl::IdBlock<mathiu::impl::RelationalKind>,_matchit::impl::IdBlock<mathiu::impl::RelationalKind>_*>
  .
  super__Move_ctor_alias<matchit::impl::IdBlock<mathiu::impl::RelationalKind>,_matchit::impl::IdBlock<mathiu::impl::RelationalKind>_*>
  .
  super__Copy_ctor_alias<matchit::impl::IdBlock<mathiu::impl::RelationalKind>,_matchit::impl::IdBlock<mathiu::impl::RelationalKind>_*>
  .
  super__Variant_storage_alias<matchit::impl::IdBlock<mathiu::impl::RelationalKind>,_matchit::impl::IdBlock<mathiu::impl::RelationalKind>_*>
  ._M_index = '\x01';
  return;
}

Assistant:

constexpr Id(Id const &id) { mBlock = BlockVT{&id.block()}; }